

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpegVideo.cpp
# Opt level: O2

uint8_t * __thiscall
MPEGSequenceHeader::deserializeExtension(MPEGSequenceHeader *this,BitStreamReader *bitReader)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint8_t *puVar4;
  undefined1 auVar5 [16];
  
  BitStreamReader::skipBit(bitReader);
  uVar2 = BitStreamReader::getBits(bitReader,3);
  this->profile = (int8_t)uVar2;
  uVar2 = BitStreamReader::getBits(bitReader,4);
  this->level = (int8_t)uVar2;
  bVar1 = BitStreamReader::getBit(bitReader);
  this->progressive_sequence = bVar1;
  uVar2 = BitStreamReader::getBits(bitReader,2);
  this->chroma_format = (uint8_t)uVar2;
  uVar2 = BitStreamReader::getBits(bitReader,2);
  this->horiz_size_ext = (uint8_t)uVar2;
  uVar3 = BitStreamReader::getBits(bitReader,2);
  this->vert_size_ext = (uint8_t)uVar3;
  uVar2._0_1_ = this->horiz_size_ext;
  uVar2._1_1_ = this->vert_size_ext;
  uVar2._2_2_ = this->bit_rate_ext;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (ulong)uVar2 & 0xffffffff0000ffff | (ulong)(ushort)uVar3 << 0x10;
  auVar5 = psllw(auVar5,0xc);
  *(uint *)&(this->super_MPEGRawDataHeader).field_0x1c =
       *(uint *)&(this->super_MPEGRawDataHeader).field_0x1c | auVar5._0_4_;
  uVar2 = BitStreamReader::getBits(bitReader,0xc);
  this->bit_rate_ext = (uint16_t)uVar2;
  this->bit_rate = this->bit_rate + uVar2 * 0x6400000;
  BitStreamReader::skipBit(bitReader);
  uVar2 = BitStreamReader::getBits(bitReader,8);
  this->rc_buffer_size = this->rc_buffer_size + uVar2 * 0x1000000;
  bVar1 = BitStreamReader::getBit(bitReader);
  this->low_delay = bVar1;
  uVar2 = BitStreamReader::getBits(bitReader,2);
  (this->frame_rate_ext).num = (uVar2 & 0xff) + 1;
  uVar2 = BitStreamReader::getBits(bitReader,5);
  (this->frame_rate_ext).den = (uVar2 & 0xff) + 1;
  puVar4 = MPEGHeader::skipProcessedBytes(bitReader);
  return puVar4;
}

Assistant:

uint8_t* MPEGSequenceHeader::deserializeExtension(BitStreamReader& bitReader)
{
    bitReader.skipBit(); /* profile and level esc*/
    profile = bitReader.getBits<int8_t>(3);
    level = bitReader.getBits<int8_t>(4);

    progressive_sequence = bitReader.getBit();     /* progressive_sequence */
    chroma_format = bitReader.getBits<uint8_t>(2); /* chroma_format 1=420, 2=422, 3=444 */

    horiz_size_ext = bitReader.getBits<uint8_t>(2);
    vert_size_ext = bitReader.getBits<uint8_t>(2);
    width |= horiz_size_ext << 12;
    height |= vert_size_ext << 12;

    bit_rate_ext = bitReader.getBits<int16_t>(12); /* XXX: handle it */
    bit_rate += (bit_rate_ext << 18) * 400;

    bitReader.skipBit();  // marker

    rc_buffer_size += bitReader.getBits(8) * 1024 * 16 << 10;

    low_delay = bitReader.getBit();  // disable b-frame if true
    frame_rate_ext.num = bitReader.getBits<uint8_t>(2) + 1;
    frame_rate_ext.den = bitReader.getBits<uint8_t>(5) + 1;

    // return bitContext.buffer_ptr;
    return skipProcessedBytes(bitReader);
}